

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

Texture2D *
glu::Texture2D::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  pointer pbVar1;
  long lVar2;
  Texture2D *pTVar3;
  TestError *this;
  long lVar4;
  size_type __n;
  allocator_type local_41;
  vector<const_char_*,_std::allocator<const_char_*>_> charPtrs;
  
  __n = (long)(filenames->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(filenames->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((int)__n == numLevels) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&charPtrs,__n,&local_41);
    lVar2 = 0;
    for (lVar4 = 0;
        pbVar1 = (filenames->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        lVar4 < (int)((ulong)((long)(filenames->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5
                     ); lVar4 = lVar4 + 1) {
      *(undefined8 *)
       ((long)charPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start + lVar2) =
           *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2 * 4);
      lVar2 = lVar2 + 8;
    }
    pTVar3 = create(context,contextInfo,archive,numLevels,
                    charPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&charPtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    return pTVar3;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"numLevels == (int)filenames.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x115);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Texture2D* Texture2D::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const std::vector<std::string>& filenames)
{
	TCU_CHECK(numLevels == (int)filenames.size());

	std::vector<const char*> charPtrs(filenames.size());
	for (int ndx = 0; ndx < (int)filenames.size(); ndx++)
		charPtrs[ndx] = filenames[ndx].c_str();

	return Texture2D::create(context, contextInfo, archive, numLevels, &charPtrs[0]);
}